

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O0

Var __thiscall
ThreadContext::
ExecuteImplicitCall<Js::JavascriptProxy::DeleteProperty(int,Js::PropertyOperationFlags)::__0>
          (ThreadContext *this,RecyclableObject *function,ImplicitCallFlags flags,
          anon_class_40_5_adc47082 implicitCall)

{
  bool bVar1;
  Attributes attributes_00;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  undefined1 local_78 [8];
  RestoreFlags restoreFlags;
  Var result_1;
  Var result;
  undefined1 local_38 [4];
  Attributes attributes;
  AutoReentrancyHandler autoReentrancyHandler;
  ImplicitCallFlags flags_local;
  RecyclableObject *function_local;
  ThreadContext *this_local;
  
  autoReentrancyHandler._15_1_ = flags;
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_38,this);
  attributes_00 = Js::FunctionInfo::GetAttributes(function);
  bVar1 = HasNoSideEffect(this,function,attributes_00);
  if (bVar1) {
    this_local = (ThreadContext *)
                 Js::JavascriptProxy::DeleteProperty::anon_class_40_5_adc47082::operator()
                           (&implicitCall);
    bVar1 = IsOnStack(this_local);
    if (bVar1) {
      AddImplicitCallFlags(this,autoReentrancyHandler._15_1_);
    }
  }
  else {
    bVar1 = IsDisableImplicitCall(this);
    if (bVar1) {
      AddImplicitCallFlags(this,autoReentrancyHandler._15_1_);
      this_00 = Js::RecyclableObject::GetScriptContext(function);
      this_01 = Js::ScriptContext::GetLibrary(this_00);
      this_local = (ThreadContext *)
                   Js::JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
    }
    else if ((attributes_00 & HasNoSideEffect) == None) {
      ExecuteImplicitCall<Js::JavascriptProxy::DeleteProperty(int,Js::PropertyOperationFlags)::
      $_0>(Js::RecyclableObject*,Js::ImplicitCallFlags,Js::JavascriptProxy::DeleteProperty(int,Js::
      PropertyOperationFlags)::$_0)::RestoreFlags::RestoreFlags(ThreadContext*,Js::
      ImplicitCallFlags_(local_78,this,autoReentrancyHandler._15_1_);
      this_local = (ThreadContext *)
                   Js::JavascriptProxy::DeleteProperty::anon_class_40_5_adc47082::operator()
                             (&implicitCall);
      ExecuteImplicitCall<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp:820:108)>
      ::RestoreFlags::~RestoreFlags((RestoreFlags *)local_78);
    }
    else {
      restoreFlags._8_8_ =
           Js::JavascriptProxy::DeleteProperty::anon_class_40_5_adc47082::operator()(&implicitCall);
      bVar1 = IsOnStack((void *)restoreFlags._8_8_);
      if (bVar1) {
        AddImplicitCallFlags(this,autoReentrancyHandler._15_1_);
      }
      this_local = (ThreadContext *)restoreFlags._8_8_;
    }
  }
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_38);
  return this_local;
}

Assistant:

inline Js::Var ExecuteImplicitCall(Js::RecyclableObject * function, Js::ImplicitCallFlags flags, Fn implicitCall)
    {
        AutoReentrancyHandler autoReentrancyHandler(this);

        Js::FunctionInfo::Attributes attributes = Js::FunctionInfo::GetAttributes(function);

        // we can hoist out const method if we know the function doesn't have side effect,
        // and the value can be hoisted.
        if (this->HasNoSideEffect(function, attributes))
        {
            // Has no side effect means the function does not change global value or
            // will check for implicit call flags
            Js::Var result = implicitCall();

            // If the value is on stack we need to bailout so that it can be boxed.
            // Instead of putting this in valueOf (or other builtins which have no side effect) adding
            // the check here to cover any other scenario we might miss.
            if (IsOnStack(result))
            {
                AddImplicitCallFlags(flags);
            }
            return result;
        }

        // Don't call the implicit call if disable implicit call
        if (IsDisableImplicitCall())
        {
            AddImplicitCallFlags(flags);
            // Return "undefined" just so we have a valid var, in case subsequent instructions are executed
            // before we bail out.
            return function->GetScriptContext()->GetLibrary()->GetUndefined();
        }

        if ((attributes & Js::FunctionInfo::HasNoSideEffect) != 0)
        {
            // Has no side effect means the function does not change global value or
            // will check for implicit call flags
            Js::Var result = implicitCall();

            // If the value is on stack we need to bailout so that it can be boxed.
            // Instead of putting this in valueOf (or other builtins which have no side effect) adding
            // the check here to cover any other scenario we might miss.
            if (IsOnStack(result))
            {
                AddImplicitCallFlags(flags);
            }
            return result;
        }

        // Save and restore implicit flags around the implicit call
        struct RestoreFlags
        {
            ThreadContext * const ctx;
            const Js::ImplicitCallFlags flags;
            const Js::ImplicitCallFlags savedFlags;

            RestoreFlags(ThreadContext *ctx, Js::ImplicitCallFlags flags) :
                ctx(ctx),
                flags(flags),
                savedFlags(ctx->GetImplicitCallFlags())
            {
            }

            ~RestoreFlags()
            {
                ctx->SetImplicitCallFlags(static_cast<Js::ImplicitCallFlags>(savedFlags | flags));
            }
        };

        RestoreFlags restoreFlags(this, flags);
        return implicitCall();
    }